

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5_pnnx.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pOVar1;
  Allocator **ppAVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined4 uVar9;
  ulong uVar6;
  undefined4 uVar10;
  undefined8 uVar7;
  undefined8 uVar8;
  char *pcVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 *puVar14;
  int *piVar15;
  bool bVar16;
  size_t *psVar17;
  char cVar18;
  int iVar19;
  int iVar20;
  float *pfVar21;
  long lVar22;
  size_t sVar23;
  uint uVar24;
  ulong uVar25;
  vector<Object,_std::allocator<Object>_> *objects_00;
  uint uVar26;
  pointer pOVar27;
  uint left;
  float fVar28;
  float fVar29;
  int w;
  int top;
  float fVar32;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar33;
  undefined8 uVar34;
  undefined1 auVar35 [16];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vector<Object,_std::allocator<Object>_> objects8;
  Mat local_378;
  vector<Object,_std::allocator<Object>_> proposals;
  int baseLine;
  Extractor ex;
  vector<float,_std::allocator<float>_> areas;
  Mat local_2a8;
  vector<Object,_std::allocator<Object>_> objects;
  float norm_vals [3];
  Mat image;
  undefined4 local_210;
  int iStack_20c;
  Allocator *local_1f8;
  Net yolov5;
  Mat m;
  undefined8 local_88;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar11 = argv[1];
    std::__cxx11::string::string((string *)&yolov5,pcVar11,(allocator *)&image);
    cv::imread((string *)&m,(int)&yolov5);
    if ((Allocator **)yolov5._vptr_Net != &yolov5.opt.blob_allocator) {
      operator_delete(yolov5._vptr_Net);
    }
    cVar18 = cv::Mat::empty();
    if (cVar18 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolov5);
      yolov5.opt.use_vulkan_compute = true;
      iVar19 = ncnn::Net::load_param(&yolov5,"yolov5s.ncnn.param");
      if ((iVar19 != 0) || (iVar19 = ncnn::Net::load_model(&yolov5,"yolov5s.ncnn.bin"), iVar19 != 0)
         ) {
        exit(-1);
      }
      iVar19 = (int)local_88;
      w = (int)((ulong)local_88 >> 0x20);
      if (iVar19 < w) {
        fVar36 = 640.0 / (float)w;
        iVar20 = (int)((float)iVar19 * fVar36);
        iVar33 = 0x280;
      }
      else {
        fVar36 = 640.0 / (float)iVar19;
        iVar33 = (int)((float)w * fVar36);
        iVar20 = 0x280;
      }
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_80,0x10002,w,iVar19,iVar33,iVar20,(Allocator *)0x0);
      local_2a8.cstep = 0;
      local_2a8.data._0_4_ = 0;
      local_2a8.data._4_4_ = 0;
      local_2a8.refcount._0_4_ = 0;
      local_2a8.refcount._4_4_ = 0;
      local_2a8.elemsize = 0;
      local_2a8.elempack = 0;
      local_2a8.allocator = (Allocator *)0x0;
      local_2a8.dims = 0;
      local_2a8.w = 0;
      local_2a8.h = 0;
      local_2a8.d = 0;
      local_2a8.c = 0;
      ncnn::Option::Option((Option *)&areas);
      iVar33 = ((iVar33 + 0x3f) / 0x40) * 0x40 - iVar33;
      iVar20 = ((iVar20 + 0x3f) / 0x40) * 0x40 - iVar20;
      left = iVar33 / 2;
      top = iVar20 / 2;
      objects_00 = (vector<Object,_std::allocator<Object>_> *)(ulong)left;
      ncnn::copy_make_border
                ((Mat *)&image,&local_2a8,top,iVar20 - top,left,iVar33 - left,0,114.0,
                 (Option *)&areas);
      norm_vals[0] = 0.003921569;
      norm_vals[1] = 0.003921569;
      norm_vals[2] = 0.003921569;
      ncnn::Mat::substract_mean_normalize(&local_2a8,(float *)0x0,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"in0",&local_2a8);
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Extractor::extract(&ex,"out0",(Mat *)&areas,0);
      local_378.cstep = 0;
      local_378.data._0_4_ = 0;
      local_378.data._4_4_ = 0;
      local_378.refcount._0_4_ = 0;
      local_378.refcount._4_4_ = 0;
      local_378.elemsize = 0;
      local_378.elempack = 0;
      local_378.allocator = (Allocator *)0x0;
      local_378.dims = 0;
      local_378.w = 0;
      local_378.h = 0;
      local_378.d = 0;
      local_378.c = 0;
      ncnn::Mat::create(&local_378,6,4,(Allocator *)0x0);
      puVar14 = (undefined8 *)CONCAT44(local_378.data._4_4_,local_378.data._0_4_);
      *puVar14 = 0x4150000041200000;
      puVar14[1] = 0x41f0000041800000;
      puVar14[2] = 0x41b8000042040000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals(&local_378,8,(Mat *)&areas,(Mat *)&objects8,0.0,objects_00);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar15 = (int *)CONCAT44(local_378.refcount._4_4_,(int)local_378.refcount);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_378.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_378.data._4_4_,local_378.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_378.data._4_4_,local_378.data._0_4_));
            }
          }
          else {
            (*(local_378.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_378.cstep = 0;
      local_378.data._0_4_ = 0;
      local_378.data._4_4_ = 0;
      local_378.refcount._0_4_ = 0;
      local_378.refcount._4_4_ = 0;
      local_378.elemsize = 0;
      local_378.elempack = 0;
      local_378.dims = 0;
      local_378.w = 0;
      local_378.h = 0;
      local_378.d = 0;
      local_378.c = 0;
      piVar15 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if ((*piVar15 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Extractor::extract(&ex,"out1",(Mat *)&areas,0);
      local_378.cstep = 0;
      local_378.data._0_4_ = 0;
      local_378.data._4_4_ = 0;
      local_378.refcount._0_4_ = 0;
      local_378.refcount._4_4_ = 0;
      local_378.elemsize = 0;
      local_378.elempack = 0;
      local_378.allocator = (Allocator *)0x0;
      local_378.dims = 0;
      local_378.w = 0;
      local_378.h = 0;
      local_378.d = 0;
      local_378.c = 0;
      ncnn::Mat::create(&local_378,6,4,(Allocator *)0x0);
      puVar14 = (undefined8 *)CONCAT44(local_378.data._4_4_,local_378.data._0_4_);
      *puVar14 = 0x4274000041f00000;
      puVar14[1] = 0x4234000042780000;
      puVar14[2] = 0x42ee0000426c0000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals(&local_378,0x10,(Mat *)&areas,(Mat *)&objects8,0.0,objects_00);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar15 = (int *)CONCAT44(local_378.refcount._4_4_,(int)local_378.refcount);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_378.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_378.data._4_4_,local_378.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_378.data._4_4_,local_378.data._0_4_));
            }
          }
          else {
            (*(local_378.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_378.cstep = 0;
      local_378.data._0_4_ = 0;
      local_378.data._4_4_ = 0;
      local_378.refcount._0_4_ = 0;
      local_378.refcount._4_4_ = 0;
      local_378.elemsize = 0;
      local_378.elempack = 0;
      local_378.dims = 0;
      local_378.w = 0;
      local_378.h = 0;
      local_378.d = 0;
      local_378.c = 0;
      piVar15 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if ((*piVar15 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Extractor::extract(&ex,"out2",(Mat *)&areas,0);
      local_378.cstep = 0;
      local_378.data._0_4_ = 0;
      local_378.data._4_4_ = 0;
      local_378.refcount._0_4_ = 0;
      local_378.refcount._4_4_ = 0;
      local_378.elemsize = 0;
      local_378.elempack = 0;
      local_378.allocator = (Allocator *)0x0;
      local_378.dims = 0;
      local_378.w = 0;
      local_378.h = 0;
      local_378.d = 0;
      local_378.c = 0;
      ncnn::Mat::create(&local_378,6,4,(Allocator *)0x0);
      puVar14 = (undefined8 *)CONCAT44(local_378.data._4_4_,local_378.data._0_4_);
      *puVar14 = 0x42b4000042e80000;
      puVar14[1] = 0x43460000431c0000;
      puVar14[2] = 0x43a3000043ba8000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals(&local_378,0x20,(Mat *)&areas,(Mat *)&objects8,0.0,objects_00);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar15 = (int *)CONCAT44(local_378.refcount._4_4_,(int)local_378.refcount);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_378.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_378.data._4_4_,local_378.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_378.data._4_4_,local_378.data._0_4_));
            }
          }
          else {
            (*(local_378.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_378.cstep = 0;
      local_378.data._0_4_ = 0;
      local_378.data._4_4_ = 0;
      local_378.refcount._0_4_ = 0;
      local_378.refcount._4_4_ = 0;
      local_378.elemsize = 0;
      local_378.elempack = 0;
      local_378.dims = 0;
      local_378.w = 0;
      local_378.h = 0;
      local_378.d = 0;
      local_378.c = 0;
      piVar15 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if ((*piVar15 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start !=
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&proposals,0,
                   (int)((ulong)((long)proposals.super__Vector_base<Object,_std::allocator<Object>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555
                   + -1);
      }
      local_378.data._0_4_ = 0;
      local_378.data._4_4_ = 0;
      local_378.elemsize = 0;
      local_378.refcount._4_4_ = 0;
      local_378.refcount._0_4_ = 0;
      uVar26 = (int)((long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x55555555;
      std::vector<float,_std::allocator<float>_>::vector
                (&areas,(long)(int)uVar26,(allocator_type *)&objects8);
      if ((int)uVar26 < 1) {
        auVar31._12_4_ = 0;
        auVar31._0_12_ =
             (undefined1  [12])
             objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
             super__Vector_impl_data._4_12_;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._0_16_ = auVar31 << 0x20;
      }
      else {
        pfVar21 = &((proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                     super__Vector_impl_data._M_start)->rect).height;
        uVar25 = 0;
        do {
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar25] = pfVar21[-1] * *pfVar21;
          uVar25 = uVar25 + 1;
          pfVar21 = pfVar21 + 6;
        } while ((uVar26 & 0x7fffffff) != uVar25);
        auVar40._12_4_ = 0;
        auVar40._0_12_ =
             (undefined1  [12])
             objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
             super__Vector_impl_data._4_12_;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._0_16_ = auVar40 << 0x20;
        iVar33 = 0;
        do {
          uVar24 = (uint)((ulong)((long)local_378.refcount -
                                 CONCAT44(local_378.data._4_4_,local_378.data._0_4_)) >> 2);
          if ((int)uVar24 < 1) {
LAB_00159cf3:
            if (local_378.refcount == (int *)local_378.elemsize) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_378,(iterator)local_378.refcount,
                         (int *)&objects8);
            }
            else {
              *local_378.refcount = iVar33;
              local_378.refcount = local_378.refcount + 1;
            }
          }
          else {
            pOVar27 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar33;
            bVar16 = true;
            uVar25 = 0;
            do {
              iVar20 = *(int *)(CONCAT44(local_378.data._4_4_,local_378.data._0_4_) + uVar25 * 4);
              if (pOVar27->label ==
                  proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar20].label) {
                pOVar1 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                         super__Vector_impl_data._M_start + iVar20;
                uVar5._0_4_ = (pOVar27->rect).x;
                uVar5._4_4_ = (pOVar27->rect).y;
                auVar35._8_8_ = 0;
                auVar35._0_8_ = uVar5;
                uVar3 = (pOVar27->rect).width;
                uVar9 = (pOVar27->rect).height;
                uVar6._0_4_ = (pOVar1->rect).x;
                uVar6._4_4_ = (pOVar1->rect).y;
                auVar39._8_8_ = 0;
                auVar39._0_8_ = uVar6;
                uVar4 = (pOVar1->rect).width;
                uVar10 = (pOVar1->rect).height;
                auVar30._0_4_ = (float)uVar4 + (float)(undefined4)uVar6;
                auVar30._4_4_ = (float)uVar10 + (float)uVar6._4_4_;
                auVar30._8_8_ = 0;
                auVar40 = maxps(auVar39,auVar35);
                auVar37._0_4_ = (float)uVar3 + (float)(undefined4)uVar5;
                auVar37._4_4_ = (float)uVar9 + (float)uVar5._4_4_;
                auVar37._8_8_ = 0;
                auVar31 = minps(auVar30,auVar37);
                fVar28 = auVar31._0_4_ - auVar40._0_4_;
                fVar32 = auVar31._4_4_ - auVar40._4_4_;
                fVar29 = 0.0;
                if (0.0 < fVar32 && 0.0 < fVar28) {
                  fVar29 = fVar28 * fVar32;
                }
                if (0.45 < fVar29 / ((areas.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start[iVar33] +
                                     areas.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                     .super__Vector_impl_data._M_start[iVar20]) - fVar29)) {
                  bVar16 = false;
                }
              }
              uVar25 = uVar25 + 1;
            } while ((uVar24 & 0x7fffffff) != uVar25);
            if (bVar16) goto LAB_00159cf3;
          }
          iVar33 = (int)objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_ + 1;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = (float)iVar33;
        } while (iVar33 < (int)uVar26);
      }
      if (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar26 = (uint)((ulong)((long)local_378.refcount -
                             CONCAT44(local_378.data._4_4_,local_378.data._0_4_)) >> 2);
      std::vector<Object,_std::allocator<Object>_>::resize(&objects,(long)(int)uVar26);
      if (0 < (int)uVar26) {
        uVar34 = CONCAT44((float)(iVar19 + -1),(float)(w + -1));
        lVar22 = 0;
        uVar25 = 0;
        do {
          iVar19 = *(int *)(CONCAT44(local_378.data._4_4_,local_378.data._0_4_) + uVar25 * 4);
          uVar7 = *(undefined8 *)
                   &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar19].rect.width;
          puVar14 = (undefined8 *)
                    ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                              super__Vector_impl_data._M_start)->rect).x + lVar22);
          *puVar14 = *(undefined8 *)
                      &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar19].rect;
          puVar14[1] = uVar7;
          *(undefined8 *)
           ((long)&(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start)->label + lVar22) =
               *(undefined8 *)
                &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar19].label;
          uVar7 = *(undefined8 *)
                   ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).x + lVar22);
          uVar8 = *(undefined8 *)
                   ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).width + lVar22);
          fVar28 = (float)uVar7;
          fVar29 = (float)((ulong)uVar7 >> 0x20);
          auVar38._0_4_ = fVar28 - (float)(int)left;
          auVar38._4_4_ = fVar29 - (float)top;
          auVar38._8_8_ = 0;
          auVar12._4_4_ = fVar36;
          auVar12._0_4_ = fVar36;
          auVar12._8_4_ = fVar36;
          auVar12._12_4_ = fVar36;
          auVar31 = divps(auVar38,auVar12);
          auVar41._0_4_ = ((float)uVar8 + fVar28) - (float)(int)left;
          auVar41._4_4_ = ((float)((ulong)uVar8 >> 0x20) + fVar29) - (float)top;
          auVar41._8_8_ = 0;
          auVar13._4_4_ = fVar36;
          auVar13._0_4_ = fVar36;
          auVar13._8_4_ = fVar36;
          auVar13._12_4_ = fVar36;
          auVar40 = divps(auVar41,auVar13);
          auVar42._8_4_ = 0xbf800000;
          auVar42._0_8_ = uVar34;
          auVar42._12_4_ = 0xbf800000;
          auVar31 = minps(auVar42,auVar31);
          auVar31 = maxps(ZEXT816(0),auVar31);
          auVar43._8_4_ = 0xbf800000;
          auVar43._0_8_ = uVar34;
          auVar43._12_4_ = 0xbf800000;
          auVar40 = minps(auVar43,auVar40);
          auVar40 = maxps(ZEXT816(0),auVar40);
          *(long *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).x + lVar22) = auVar31._0_8_;
          *(ulong *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                              super__Vector_impl_data._M_start)->rect).width + lVar22) =
               CONCAT44(auVar40._4_4_ - auVar31._4_4_,auVar40._0_4_ - auVar31._0_4_);
          uVar25 = uVar25 + 1;
          lVar22 = lVar22 + 0x18;
        } while ((uVar26 & 0x7fffffff) != uVar25);
      }
      if ((void *)CONCAT44(local_378.data._4_4_,local_378.data._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_378.data._4_4_,local_378.data._0_4_));
      }
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ncnn::Extractor::~Extractor(&ex);
      piVar15 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_2a8.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_2a8.data._4_4_,local_2a8.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_2a8.data._4_4_,local_2a8.data._0_4_));
            }
          }
          else {
            (*(local_2a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_2a8.cstep = 0;
      local_2a8.data._0_4_ = 0;
      local_2a8.data._4_4_ = 0;
      local_2a8.refcount._0_4_ = 0;
      local_2a8.refcount._4_4_ = 0;
      local_2a8.elemsize = 0;
      local_2a8.elempack = 0;
      local_2a8.dims = 0;
      local_2a8.w = 0;
      local_2a8.h = 0;
      local_2a8.d = 0;
      local_2a8.c = 0;
      piVar15 = (int *)CONCAT44(iStack_20c,local_210);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_1f8 == (Allocator *)0x0) {
            if (_image != (void *)0x0) {
              free(_image);
            }
          }
          else {
            (*local_1f8->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&yolov5);
      cv::Mat::clone();
      psVar17 = (size_t *)CONCAT44(local_2a8.data._4_4_,local_2a8.data._0_4_);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar22 = 0;
        uVar25 = 0;
        pOVar27 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          local_2a8.data = psVar17;
          fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                  (double)*(float *)((long)&pOVar27->prob + lVar22),
                  (double)*(float *)((long)&(pOVar27->rect).x + lVar22),
                  (double)*(float *)((long)&(pOVar27->rect).y + lVar22),
                  (double)*(float *)((long)&(pOVar27->rect).width + lVar22),
                  (double)*(float *)((long)&(pOVar27->rect).height + lVar22),
                  (ulong)*(uint *)((long)&pOVar27->label + lVar22));
          local_2a8.elemsize = 0;
          local_2a8.data._0_4_ = 0x3010000;
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ =
               (int)ROUND(*(float *)((long)&(pOVar27->rect).y + lVar22));
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ =
               (int)ROUND(*(float *)((long)&(pOVar27->rect).x + lVar22));
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ =
               (int)ROUND(*(float *)((long)&(pOVar27->rect).width + lVar22));
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ =
               (int)ROUND(*(float *)((long)&(pOVar27->rect).height + lVar22));
          yolov5._vptr_Net = (_func_int **)0x406fe00000000000;
          yolov5.opt.lightmode = false;
          yolov5.opt._1_3_ = 0;
          yolov5.opt.num_threads = 0;
          yolov5.opt.blob_allocator = (Allocator *)0x0;
          yolov5.opt.workspace_allocator = (Allocator *)0x0;
          local_2a8.refcount = (int *)&image;
          cv::rectangle(&local_2a8,&proposals,&yolov5,1,8,0);
          sprintf((char *)&yolov5,"%s %.1f%%",
                  (double)(*(float *)((long)&pOVar27->prob + lVar22) * 100.0),
                  _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                  *(int *)(
                          _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                          + (long)*(int *)((long)&pOVar27->label + lVar22) * 4));
          local_2a8.data = &local_2a8.elemsize;
          sVar23 = strlen((char *)&yolov5);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a8,&yolov5,(long)&yolov5._vptr_Net + sVar23);
          cv::getTextSize((string *)&ex,(int)&local_2a8,0.5,0,(int *)0x1);
          if ((size_t *)local_2a8.data != &local_2a8.elemsize) {
            operator_delete(local_2a8.data);
          }
          fVar36 = (float)(int)*(float *)((long)&(pOVar27->rect).x + lVar22);
          iVar19 = (int)((*(float *)((long)&(pOVar27->rect).y + lVar22) -
                         (float)ex._vptr_Extractor._4_4_) - 0.0);
          if (iVar19 < 1) {
            iVar19 = 0;
          }
          fVar28 = (float)(iStack_20c - (int)ex._vptr_Extractor);
          if ((int)ex._vptr_Extractor + (int)fVar36 <= iStack_20c) {
            fVar28 = fVar36;
          }
          local_378.elemsize = 0;
          local_378.data._0_4_ = 0x3010000;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ = iVar19;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = fVar28;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = (int)ex._vptr_Extractor;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = ex._vptr_Extractor._4_4_;
          local_2a8.data._0_4_ = 0;
          local_2a8.data._4_4_ = 0x406fe000;
          local_2a8.refcount._0_4_ = 0;
          local_2a8.refcount._4_4_ = 0x406fe000;
          local_2a8.elemsize = 0x406fe00000000000;
          local_2a8.elempack = 0;
          local_2a8._28_4_ = 0;
          local_378.refcount = (int *)&image;
          cv::rectangle(&local_378,&objects8,&local_2a8,0xffffffff,8,0);
          local_378.elemsize = 0;
          local_378.data._0_4_ = 0x3010000;
          local_2a8.data = &local_2a8.elemsize;
          local_378.refcount = (int *)&image;
          sVar23 = strlen((char *)&yolov5);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a8,&yolov5,(long)&yolov5._vptr_Net + sVar23);
          norm_vals[1] = (float)(iVar19 + ex._vptr_Extractor._4_4_);
          norm_vals[0] = fVar28;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ = 0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._4_4_ = 0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          cv::putText(0x3fe0000000000000,&local_378,&local_2a8,norm_vals,0,&areas,1,8,0);
          psVar17 = (size_t *)local_2a8.data;
          if ((size_t *)local_2a8.data != &local_2a8.elemsize) {
            operator_delete(local_2a8.data);
            psVar17 = (size_t *)local_2a8.data;
          }
          local_2a8.data._4_4_ = (undefined4)((ulong)psVar17 >> 0x20);
          uVar25 = uVar25 + 1;
          lVar22 = lVar22 + 0x18;
          pOVar27 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar25 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      local_2a8.refcount = (int *)&image;
      ppAVar2 = &yolov5.opt.blob_allocator;
      yolov5.opt.blob_allocator =
           (Allocator *)CONCAT26(yolov5.opt.blob_allocator._6_2_,0x6567616d69);
      yolov5.opt.lightmode = true;
      yolov5.opt._1_3_ = 0;
      yolov5.opt.num_threads = 0;
      local_2a8.elemsize = 0;
      local_2a8.data._0_4_ = 0x1010000;
      yolov5._vptr_Net = (_func_int **)ppAVar2;
      cv::imshow((string *)&yolov5,(_InputArray *)&local_2a8);
      if ((Allocator **)yolov5._vptr_Net != ppAVar2) {
        operator_delete(yolov5._vptr_Net);
      }
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar19 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar11);
      iVar19 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar19 = -1;
  }
  return iVar19;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_yolov5(m, objects);

    draw_objects(m, objects);

    return 0;
}